

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  uint64_t *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int w;
  long lVar5;
  secp256k1_gej *psVar6;
  secp256k1_fe *psVar7;
  ulong uVar8;
  secp256k1_ge *psVar9;
  secp256k1_gej *psVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *in_R8;
  secp256k1_ge *psVar12;
  long lVar13;
  int *piVar14;
  secp256k1_fe *psVar15;
  bool bVar16;
  byte bVar17;
  undefined1 local_d58 [8];
  ulong local_d50;
  uint local_d44;
  secp256k1_scalar *local_d40;
  secp256k1_fe *local_d38;
  secp256k1_gej *local_d30;
  secp256k1_ge local_d28;
  secp256k1_fe Z;
  uint64_t local_ca8;
  uint64_t uStack_ca0;
  undefined1 local_c98 [16];
  uint64_t local_c88;
  uint64_t uStack_c80;
  undefined1 local_c78 [16];
  secp256k1_fe aux [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  bVar17 = 0;
  Z.n[0] = 1;
  Z.n[1] = 0;
  Z.n[2] = 0;
  Z.n[3] = 0;
  Z.n[4] = 0;
  local_d38 = &a->z;
  bVar16 = true;
  uVar8 = 0;
  lVar13 = 0;
  local_d40 = ng;
  local_d30 = r;
  while (bVar16) {
    iVar2 = secp256k1_scalar_is_zero(na);
    w = (int)ng;
    if ((iVar2 == 0) && (a->infinity == 0)) {
      secp256k1_scalar_split_lambda
                ((secp256k1_scalar *)wnaf_ng_128,(secp256k1_scalar *)&local_d28,na);
      ps[0].bits_na_1 =
           secp256k1_ecmult_wnaf(ps[lVar13].wnaf_na_1,(int)wnaf_ng_128,(secp256k1_scalar *)0x5,w);
      ps[0].bits_na_lam =
           secp256k1_ecmult_wnaf(ps[lVar13].wnaf_na_lam,(int)&local_d28,(secp256k1_scalar *)0x5,w);
      uVar4 = (uint)uVar8;
      if ((int)(uint)uVar8 < ps[0].bits_na_1) {
        uVar4 = ps[0].bits_na_1;
      }
      if ((int)uVar4 < ps[0].bits_na_lam) {
        uVar4 = ps[0].bits_na_lam;
      }
      local_d50 = (ulong)uVar4;
      ng = (secp256k1_scalar *)wnaf_ng_1;
      psVar6 = a;
      psVar10 = (secp256k1_gej *)ng;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (psVar10->x).n[0] = (psVar6->x).n[0];
        psVar6 = (secp256k1_gej *)((long)psVar6 + (ulong)bVar17 * -0x10 + 8);
        psVar10 = (secp256k1_gej *)((long)psVar10 + (ulong)bVar17 * -0x10 + 8);
      }
      if (lVar13 != 0) {
        secp256k1_gej_rescale((secp256k1_gej *)ng,&Z);
      }
      psVar12 = (secp256k1_ge *)(aux + lVar13 * 8);
      secp256k1_ecmult_odd_multiples_table
                ((int)local_d58 + (int)lVar13 * 0x2c0 + 0xa60,psVar12,&Z,(secp256k1_fe *)ng,in_R8);
      if (lVar13 != 0) {
        secp256k1_fe_impl_mul((secp256k1_fe *)psVar12,(secp256k1_fe *)psVar12,local_d38);
      }
      lVar13 = lVar13 + 1;
      uVar8 = local_d50;
    }
    bVar16 = false;
  }
  local_d50 = uVar8;
  if (lVar13 != 0) {
    secp256k1_ge_table_set_globalz(lVar13 * 8,pre_a,aux);
  }
  psVar7 = aux;
  psVar12 = pre_a;
  local_d38 = (secp256k1_fe *)lVar13;
  for (lVar5 = 0; (secp256k1_fe *)lVar5 != local_d38; lVar5 = lVar5 + 1) {
    psVar9 = psVar12;
    for (lVar13 = 0; lVar13 != 0x140; lVar13 = lVar13 + 0x28) {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)((long)psVar7->n + lVar13),&psVar9->x,&secp256k1_const_beta);
      psVar9 = psVar9 + 1;
    }
    psVar7 = psVar7 + 8;
    psVar12 = psVar12 + 8;
  }
  if (local_d40 == (secp256k1_scalar *)0x0) {
    local_d40 = (secp256k1_scalar *)0x0;
    local_d44 = 0;
    uVar8 = local_d50;
  }
  else {
    local_c88 = local_d40->d[0];
    uStack_c80 = local_d40->d[1];
    local_c78 = (undefined1  [16])0x0;
    local_ca8 = local_d40->d[2];
    uStack_ca0 = local_d40->d[3];
    local_c98 = (undefined1  [16])0x0;
    uVar3 = secp256k1_ecmult_wnaf(wnaf_ng_1,(int)&local_c88,(secp256k1_scalar *)0xf,(int)ng);
    local_d44 = secp256k1_ecmult_wnaf(wnaf_ng_128,(int)&local_ca8,(secp256k1_scalar *)0xf,(int)ng);
    local_d40 = (secp256k1_scalar *)CONCAT44(local_d40._4_4_,uVar3);
    uVar4 = (uint)local_d50;
    if ((int)(uint)local_d50 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if ((int)uVar4 < (int)local_d44) {
      uVar4 = local_d44;
    }
    uVar8 = (ulong)uVar4;
  }
  psVar6 = local_d30;
  secp256k1_gej_set_infinity(local_d30);
  uVar8 = uVar8 & 0xffffffff;
  lVar13 = uVar8 * 4;
  while (iVar2 = (int)uVar8, 0 < iVar2) {
    local_d50 = uVar8 - 1;
    secp256k1_gej_double_var(psVar6,psVar6,(secp256k1_fe *)0x0);
    piVar14 = &ps[0].bits_na_lam;
    psVar12 = pre_a;
    psVar7 = aux;
    psVar15 = local_d38;
    while (psVar6 = local_d30, uVar8 = local_d50, bVar16 = psVar15 != (secp256k1_fe *)0x0,
          psVar15 = (secp256k1_fe *)((long)psVar15 + -1), bVar16) {
      if ((iVar2 <= piVar14[-1]) && (uVar4 = *(uint *)((long)piVar14 + lVar13 + -0x410), uVar4 != 0)
         ) {
        if ((int)uVar4 < 1) {
          psVar9 = psVar12 + (~uVar4 >> 1);
          psVar11 = &local_d28;
          for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
            (psVar11->x).n[0] = (psVar9->x).n[0];
            psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar17 * -0x10 + 8);
            psVar11 = (secp256k1_ge *)((long)psVar11 + (ulong)bVar17 * -0x10 + 8);
          }
          local_d28.y.n[0] = 0x3ffffbfffff0bc - local_d28.y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - local_d28.y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - local_d28.y.n[2];
          local_d28.y.n[3] = 0x3ffffffffffffc - local_d28.y.n[3];
          local_d28.y.n[4] = 0x3fffffffffffc - local_d28.y.n[4];
        }
        else {
          psVar9 = psVar12 + (uVar4 - 1 >> 1);
          psVar11 = &local_d28;
          for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
            (psVar11->x).n[0] = (psVar9->x).n[0];
            psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar17 * -0x10 + 8);
            psVar11 = (secp256k1_ge *)((long)psVar11 + (ulong)bVar17 * -0x10 + 8);
          }
        }
        ng = (secp256k1_scalar *)0x0;
        secp256k1_gej_add_ge_var(local_d30,local_d30,&local_d28,(secp256k1_fe *)0x0);
      }
      if ((iVar2 <= *piVar14) && (uVar4 = *(uint *)((long)piVar14 + lVar13 + -0x20c), uVar4 != 0)) {
        local_d28.infinity = 0;
        if ((int)uVar4 < 1) {
          uVar4 = ~uVar4 >> 1;
          local_d28.x.n[4] = psVar7[uVar4].n[4];
          local_d28.x.n[0] = psVar7[uVar4].n[0];
          local_d28.x.n[1] = psVar7[uVar4].n[1];
          local_d28.x.n[2] = psVar7[uVar4].n[2];
          local_d28.x.n[3] = (psVar7[uVar4].n + 2)[1];
          puVar1 = psVar12[uVar4].y.n + 2;
          local_d28.y.n[0] = 0x3ffffbfffff0bc - psVar12[uVar4].y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - psVar12[uVar4].y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - *puVar1;
          local_d28.y.n[3] = 0x3ffffffffffffc - puVar1[1];
          local_d28.y.n[4] = 0x3fffffffffffc - psVar12[uVar4].y.n[4];
        }
        else {
          uVar4 = uVar4 - 1 >> 1;
          local_d28.x.n[4] = psVar7[uVar4].n[4];
          local_d28.x.n[0] = psVar7[uVar4].n[0];
          local_d28.x.n[1] = psVar7[uVar4].n[1];
          local_d28.x.n[2] = psVar7[uVar4].n[2];
          local_d28.x.n[3] = (psVar7[uVar4].n + 2)[1];
          local_d28.y.n[4] = psVar12[uVar4].y.n[4];
          local_d28.y.n[0] = psVar12[uVar4].y.n[0];
          local_d28.y.n[1] = psVar12[uVar4].y.n[1];
          puVar1 = psVar12[uVar4].y.n + 2;
          local_d28.y.n[2] = *puVar1;
          local_d28.y.n[3] = puVar1[1];
        }
        ng = (secp256k1_scalar *)0x0;
        secp256k1_gej_add_ge_var(local_d30,local_d30,&local_d28,(secp256k1_fe *)0x0);
      }
      psVar7 = psVar7 + 8;
      psVar12 = psVar12 + 8;
      piVar14 = piVar14 + 0x104;
    }
    if ((iVar2 <= (int)local_d40) && (wnaf_ng_1[local_d50] != 0)) {
      secp256k1_ecmult_table_get_ge_storage(&local_d28,secp256k1_pre_g,wnaf_ng_1[local_d50],(int)ng)
      ;
      ng = (secp256k1_scalar *)&Z;
      secp256k1_gej_add_zinv_var(psVar6,psVar6,&local_d28,(secp256k1_fe *)ng);
    }
    if ((iVar2 <= (int)local_d44) && (wnaf_ng_128[uVar8] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                (&local_d28,secp256k1_pre_g_128,wnaf_ng_128[uVar8],(int)ng);
      ng = (secp256k1_scalar *)&Z;
      secp256k1_gej_add_zinv_var(psVar6,psVar6,&local_d28,(secp256k1_fe *)ng);
    }
    lVar13 = lVar13 + -4;
  }
  if (psVar6->infinity == 0) {
    secp256k1_fe_impl_mul(&psVar6->z,&psVar6->z,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}